

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint64_t uVar26;
  ulong uVar27;
  uint64_t uVar28;
  ulong uVar29;
  uint64_t uVar30;
  ulong local_118;
  ulong local_110;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  
  local_f8 = *hash ^ *block;
  *hash = local_f8;
  local_b0 = hash[1] ^ block[1];
  hash[1] = local_b0;
  local_a8 = hash[2] ^ block[2];
  hash[2] = local_a8;
  uVar11 = hash[3] ^ block[3];
  hash[3] = uVar11;
  local_a0 = hash[4] ^ block[4];
  hash[4] = local_a0;
  local_e8 = hash[5] ^ block[5];
  hash[5] = local_e8;
  uVar20 = hash[6] ^ block[6];
  hash[6] = uVar20;
  local_d0 = hash[7] ^ block[7];
  hash[7] = local_d0;
  local_c0 = hash[8] ^ block[8];
  hash[8] = local_c0;
  local_b8 = hash[9];
  if (block_size < 0x49) {
    uVar1 = hash[10];
    local_110 = hash[0xb];
    uVar28 = hash[0xc];
  }
  else {
    local_b8 = local_b8 ^ block[9];
    hash[9] = local_b8;
    uVar1 = hash[10] ^ block[10];
    hash[10] = uVar1;
    local_110 = hash[0xb] ^ block[0xb];
    hash[0xb] = local_110;
    uVar28 = hash[0xc] ^ block[0xc];
    hash[0xc] = uVar28;
    if (0x68 < block_size) {
      hash[0xd] = hash[0xd] ^ block[0xd];
      hash[0xe] = hash[0xe] ^ block[0xe];
      hash[0xf] = hash[0xf] ^ block[0xf];
      hash[0x10] = hash[0x10] ^ block[0x10];
      if (0x88 < block_size) {
        hash[0x11] = hash[0x11] ^ block[0x11];
      }
    }
  }
  uVar4 = hash[0x10];
  local_e0 = hash[0x15];
  uVar26 = hash[0xd];
  uVar30 = hash[0xe];
  local_c8 = hash[0x13];
  local_118 = hash[0x18];
  local_100 = hash[0x11];
  local_d8 = hash[0x16];
  uVar19 = hash[0xf];
  local_98 = hash[0x14];
  uVar17 = hash[0x12];
  local_90 = hash[0x17];
  lVar14 = 0;
  do {
    uVar5 = local_110 ^ uVar4 ^ uVar20 ^ local_b0 ^ local_e0;
    uVar27 = uVar28 ^ local_100 ^ local_d0 ^ local_a8 ^ local_d8;
    uVar8 = local_a0 ^ local_b8 ^ uVar30 ^ local_c8 ^ local_118 ^
            (uVar5 << 1 | (ulong)((long)uVar5 < 0));
    uVar6 = local_f8 ^ local_e8 ^ uVar1 ^ uVar19 ^ local_98 ^
            (uVar27 << 1 | (ulong)((long)uVar27 < 0));
    uVar5 = uVar26 ^ uVar17 ^ local_c0 ^ uVar11 ^ local_90;
    uVar23 = uVar20 ^ local_b0 ^ local_110 ^ uVar4 ^ local_e0 ^
             (uVar5 << 1 | (ulong)((long)uVar5 < 0));
    uVar27 = uVar30 ^ local_c8 ^ local_a0 ^ local_b8 ^ local_118;
    uVar5 = uVar1 ^ uVar19 ^ local_f8 ^ local_e8 ^ local_98;
    uVar12 = local_d0 ^ local_a8 ^ uVar28 ^ local_100 ^ local_d8 ^
             (uVar27 << 1 | (ulong)((long)uVar27 < 0));
    uVar16 = local_c0 ^ uVar11 ^ uVar26 ^ uVar17 ^ local_90 ^
             (uVar5 << 1 | (ulong)((long)uVar5 < 0));
    local_f8 = local_f8 ^ uVar8;
    uVar5 = local_e8 ^ uVar8;
    uVar9 = uVar8 ^ local_98;
    uVar2 = local_b0 ^ uVar6;
    uVar27 = local_d0 ^ uVar23;
    uVar24 = uVar23 ^ local_d8;
    uVar13 = uVar12 ^ local_90;
    uVar7 = local_a0 ^ uVar16;
    uVar10 = (local_a8 ^ uVar23) << 0x3e | (local_a8 ^ uVar23) >> 2;
    uVar3 = (uVar11 ^ uVar12) << 0x1c | (uVar11 ^ uVar12) >> 0x24;
    uVar21 = (uVar20 ^ uVar6) << 0x2c | (uVar20 ^ uVar6) >> 0x14;
    uVar29 = (uVar28 ^ uVar23) << 0x2b | (uVar28 ^ uVar23) >> 0x15;
    uVar11 = (uVar17 ^ uVar12) << 0x15 | (uVar17 ^ uVar12) >> 0x2b;
    local_a0 = (uVar16 ^ local_118) << 0xe | (uVar16 ^ local_118) >> 0x32;
    local_a8 = ~uVar11 & local_a0 ^ uVar29;
    local_b0 = ~uVar29 & uVar11 ^ uVar21;
    uVar25 = (local_c0 ^ uVar12) << 0x37 | (local_c0 ^ uVar12) >> 9;
    uVar20 = (uVar30 ^ uVar16) << 0x27 | (uVar30 ^ uVar16) >> 0x19;
    uVar18 = (uVar19 ^ uVar8) << 0x29 | (uVar19 ^ uVar8) >> 0x17;
    uVar22 = (uVar6 ^ local_e0) << 2 | (uVar6 ^ local_e0) >> 0x3e;
    local_98 = ~uVar25 & uVar20 ^ uVar10;
    local_d8 = ~uVar18 & uVar22 ^ uVar20;
    local_e0 = ~uVar20 & uVar18 ^ uVar25;
    uVar15 = (local_b8 ^ uVar16) << 0x14 | (local_b8 ^ uVar16) >> 0x2c;
    local_d0 = (uVar1 ^ uVar8) << 3 | (uVar1 ^ uVar8) >> 0x3d;
    local_c0 = (uVar4 ^ uVar6) << 0x2d | (uVar4 ^ uVar6) >> 0x13;
    local_b8 = uVar24 << 0x3d | uVar24 >> 3;
    local_e8 = ~uVar15 & local_d0 ^ uVar3;
    uVar20 = ~local_d0 & local_c0 ^ uVar15;
    uVar11 = ~local_a0 & local_f8 ^ uVar11;
    local_a0 = ~local_f8 & uVar21 ^ local_a0;
    local_d0 = ~local_c0 & local_b8 ^ local_d0;
    local_c0 = ~local_b8 & uVar3 ^ local_c0;
    local_b8 = uVar15 & ~uVar3 ^ local_b8;
    local_90 = ~uVar22 & uVar10 ^ uVar18;
    uVar8 = uVar7 << 0x1b | uVar7 >> 0x25;
    uVar7 = uVar5 << 0x24 | uVar5 >> 0x1c;
    uVar4 = (local_110 ^ uVar6) << 10 | (local_110 ^ uVar6) >> 0x36;
    uVar15 = (local_100 ^ uVar23) << 0xf | (local_100 ^ uVar23) >> 0x31;
    uVar3 = uVar13 << 0x38 | uVar13 >> 8;
    uVar17 = ~uVar3 & uVar8 ^ uVar15;
    local_100 = ~uVar15 & uVar3 ^ uVar4;
    uVar13 = uVar2 << 1 | (ulong)((long)uVar2 < 0);
    uVar5 = uVar27 << 6 | uVar27 >> 0x3a;
    uVar27 = (uVar26 ^ uVar12) << 0x19 | (uVar26 ^ uVar12) >> 0x27;
    uVar6 = (local_c8 ^ uVar16) << 8 | (local_c8 ^ uVar16) >> 0x38;
    uVar2 = uVar9 << 0x12 | uVar9 >> 0x2e;
    uVar28 = ~uVar6 & uVar2 ^ uVar27;
    uVar26 = ~uVar2 & uVar13 ^ uVar6;
    uVar1 = ~uVar5 & uVar27 ^ uVar13;
    local_110 = ~uVar27 & uVar6 ^ uVar5;
    uVar30 = ~uVar13 & uVar5 ^ uVar2;
    uVar19 = ~uVar7 & uVar4 ^ uVar8;
    uVar4 = ~uVar4 & uVar15 ^ uVar7;
    local_c8 = ~uVar8 & uVar7 ^ uVar3;
    local_118 = ~uVar10 & uVar25 ^ uVar22;
    local_f8 = ~uVar21 & uVar29 ^ *(ulong *)((long)keccak_round_constants + lVar14) ^ local_f8;
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0xc0);
  hash[1] = local_b0;
  hash[6] = uVar20;
  hash[0xb] = local_110;
  hash[0x10] = uVar4;
  hash[0x15] = local_e0;
  hash[4] = local_a0;
  hash[9] = local_b8;
  hash[0xe] = uVar30;
  hash[0x13] = local_c8;
  hash[0x18] = local_118;
  hash[2] = local_a8;
  hash[7] = local_d0;
  hash[0xc] = uVar28;
  hash[0x11] = local_100;
  hash[0x16] = local_d8;
  *hash = local_f8;
  hash[5] = local_e8;
  hash[10] = uVar1;
  hash[0xf] = uVar19;
  hash[0x14] = local_98;
  hash[3] = uVar11;
  hash[8] = local_c0;
  hash[0xd] = uVar26;
  hash[0x12] = uVar17;
  hash[0x17] = local_90;
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t* block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}